

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O2

ssize_t sf_parse_inner_list(nghttp2_sf_value *dest,uint8_t *begin,uint8_t *end)

{
  ssize_t sVar1;
  uint8_t *begin_00;
  
  if (*begin == '(') {
    begin_00 = begin + 1;
    while (begin_00 != end) {
      if (*begin_00 == ' ') {
        begin_00 = begin_00 + 1;
      }
      else {
        if (*begin_00 == ')') {
          sVar1 = sf_parse_params(begin_00 + 1,end);
          if (sVar1 < 0) {
            return -1;
          }
          if (dest != (nghttp2_sf_value *)0x0) {
            dest->type = '\x06';
          }
          return (ssize_t)(begin_00 + 1 + (sVar1 - (long)begin));
        }
        sVar1 = sf_parse_item((nghttp2_sf_value *)0x0,begin_00,end);
        if (sVar1 < 0) {
          return -1;
        }
        begin_00 = begin_00 + sVar1;
        if (begin_00 == end) {
          return -1;
        }
        if ((*begin_00 != ' ') && (*begin_00 != ')')) {
          return -1;
        }
      }
    }
  }
  return -1;
}

Assistant:

static ssize_t sf_parse_inner_list(nghttp2_sf_value *dest, const uint8_t *begin,
                                   const uint8_t *end) {
  const uint8_t *p = begin;
  ssize_t slen;

  if (*p++ != '(') {
    return -1;
  }

  for (;;) {
    sf_discard_sp_end_err(p, end, -1);

    if (*p == ')') {
      ++p;

      slen = sf_parse_params(p, end);
      if (slen < 0) {
        return -1;
      }

      p += slen;

      if (dest) {
        dest->type = NGHTTP2_SF_VALUE_TYPE_INNER_LIST;
      }

      return p - begin;
    }

    slen = sf_parse_item(NULL, p, end);
    if (slen < 0) {
      return -1;
    }

    p += slen;

    if (p == end || (*p != ' ' && *p != ')')) {
      return -1;
    }
  }
}